

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetwindow.cpp
# Opt level: O0

void __thiscall QWidgetWindow::scheduleRepaint(QWidgetWindow *this)

{
  bool bVar1;
  long lVar2;
  QTLWExtra *this_00;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  QRect QVar3;
  QRect *unaff_retaddr;
  QWidgetRepaintManager *in_stack_00000008;
  QTLWExtra *tlwExtra;
  QWidgetPrivate *in_stack_ffffffffffffffb0;
  byte local_41;
  QWidget *in_stack_ffffffffffffffc8;
  undefined8 local_18;
  QWidget *widget;
  
  widget = *(QWidget **)(in_FS_OFFSET + 0x28);
  lVar2 = QWindow::screen();
  if (lVar2 != 0) {
    QPointer<QWidget>::operator->((QPointer<QWidget> *)0x3b7b73);
    bVar1 = QWidget::isVisible((QWidget *)0x3b7b7b);
    local_41 = 1;
    if (bVar1) {
      QPointer<QWidget>::operator->((QPointer<QWidget> *)0x3b7b98);
      bVar1 = QWidget::updatesEnabled((QWidget *)0x3b7ba0);
      local_41 = 1;
      if (bVar1) {
        QPointer<QWidget>::operator->((QPointer<QWidget> *)0x3b7bbd);
        QVar3 = QWidget::rect(in_stack_ffffffffffffffc8);
        local_18 = QVar3._8_8_;
        bVar1 = QRect::isValid((QRect *)in_stack_ffffffffffffffb0);
        local_41 = bVar1 ^ 0xff;
      }
    }
    if ((local_41 & 1) == 0) {
      QPointer<QWidget>::operator->((QPointer<QWidget> *)0x3b7bfc);
      QWidget::window(in_RDI);
      QWidget::d_func((QWidget *)0x3b7c0c);
      this_00 = QWidgetPrivate::maybeTopData(in_stack_ffffffffffffffb0);
      if ((this_00 != (QTLWExtra *)0x0) && (this_00->backingStore != (QBackingStore *)0x0)) {
        std::unique_ptr<QWidgetRepaintManager,_std::default_delete<QWidgetRepaintManager>_>::
        operator->((unique_ptr<QWidgetRepaintManager,_std::default_delete<QWidgetRepaintManager>_> *
                   )0x3b7c3b);
        QPointer<QWidget>::operator->((QPointer<QWidget> *)0x3b7c4e);
        QWidget::rect((QWidget *)this_00);
        ::QPointer::operator_cast_to_QWidget_((QPointer<QWidget> *)0x3b7c6e);
        QWidgetRepaintManager::markDirty<QRect>
                  (in_stack_00000008,unaff_retaddr,widget,(UpdateTime)((ulong)local_18 >> 0x20),
                   (BufferState)local_18);
      }
    }
  }
  if (*(QWidget **)(in_FS_OFFSET + 0x28) != widget) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidgetWindow::scheduleRepaint()
{
    if (!screen())
        return;

    if (!m_widget->isVisible() || !m_widget->updatesEnabled() || !m_widget->rect().isValid())
        return;

    QTLWExtra *tlwExtra = m_widget->window()->d_func()->maybeTopData();
    if (tlwExtra && tlwExtra->backingStore) {
        tlwExtra->repaintManager->markDirty(m_widget->rect(), m_widget,
            QWidgetRepaintManager::UpdateLater, QWidgetRepaintManager::BufferInvalid);
    }
}